

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

Index __thiscall wasm::Builder::addVar(Builder *this,Function *func,Name name,Type type)

{
  Index IVar1;
  bool bVar2;
  mapped_type *pmVar3;
  mapped_type *this_00;
  Index local_2c;
  Builder *pBStack_28;
  Index index;
  Function *func_local;
  Type type_local;
  Name name_local;
  
  func_local = name.super_IString.str._M_str;
  pBStack_28 = this;
  type_local.id = (uintptr_t)func;
  bVar2 = Type::isConcrete((Type *)&func_local);
  if (bVar2) {
    local_2c = ::wasm::Function::getNumLocals();
    bVar2 = IString::is((IString *)&type_local);
    IVar1 = local_2c;
    if (bVar2) {
      pmVar3 = std::
               unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
               ::operator[]((unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                             *)(pBStack_28 + 0x15),(key_type *)&type_local);
      *pmVar3 = IVar1;
      this_00 = std::
                unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                ::operator[]((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                              *)(pBStack_28 + 0xe),&local_2c);
      Name::operator=(this_00,(Name *)&type_local);
    }
    std::vector<wasm::Type,std::allocator<wasm::Type>>::emplace_back<wasm::Type&>
              ((vector<wasm::Type,std::allocator<wasm::Type>> *)(pBStack_28 + 9),(Type *)&func_local
              );
    return local_2c;
  }
  __assert_fail("type.isConcrete()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-builder.h"
                ,0x4ca,"static Index wasm::Builder::addVar(Function *, Name, Type)");
}

Assistant:

static Index addVar(Function* func, Name name, Type type) {
    // always ok to add a var, it does not affect other indices
    assert(type.isConcrete());
    Index index = func->getNumLocals();
    if (name.is()) {
      func->localIndices[name] = index;
      func->localNames[index] = name;
    }
    func->vars.emplace_back(type);
    return index;
  }